

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlNodePtr xmlRelaxNGSkipIgnored(xmlRelaxNGValidCtxtPtr ctxt,xmlNodePtr node)

{
  xmlElementType xVar1;
  byte *pbVar2;
  ulong uVar3;
  
  if (node != (xmlNodePtr)0x0) {
    do {
      xVar1 = node->type;
      if (XML_XINCLUDE_END < xVar1) {
        return node;
      }
      if ((0x180180U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
        if ((0x18U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
          return node;
        }
        if (((ctxt->flags & 4) == 0) && (pbVar2 = node->content, pbVar2 != (byte *)0x0)) {
          while( true ) {
            uVar3 = (ulong)*pbVar2;
            if (0x20 < uVar3) {
              return node;
            }
            if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
            pbVar2 = pbVar2 + 1;
          }
          if (uVar3 != 0) {
            return node;
          }
        }
      }
      node = node->next;
    } while (node != (_xmlNode *)0x0);
  }
  return (xmlNodePtr)0x0;
}

Assistant:

static xmlNodePtr
xmlRelaxNGSkipIgnored(xmlRelaxNGValidCtxtPtr ctxt ATTRIBUTE_UNUSED,
                      xmlNodePtr node)
{
    /*
     * TODO complete and handle entities
     */
    while ((node != NULL) &&
           ((node->type == XML_COMMENT_NODE) ||
            (node->type == XML_PI_NODE) ||
	    (node->type == XML_XINCLUDE_START) ||
	    (node->type == XML_XINCLUDE_END) ||
            (((node->type == XML_TEXT_NODE) ||
              (node->type == XML_CDATA_SECTION_NODE)) &&
             ((ctxt->flags & FLAGS_MIXED_CONTENT) ||
              (IS_BLANK_NODE(node)))))) {
        node = node->next;
    }
    return (node);
}